

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_read_header(archive_read *a,archive_entry *entry)

{
  char head_type;
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  archive_entry *entry_00;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  uchar *buf;
  uLong uVar7;
  short *psVar8;
  char *pcVar9;
  long request;
  long request_00;
  int unaff_EBP;
  size_t min;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  ssize_t did_read;
  uint local_40;
  undefined4 uStack_3c;
  archive_entry *local_38;
  
  (a->archive).archive_format = 0xd0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "RAR";
  }
  puVar2 = (uint *)a->format->data;
  if (puVar2[0x13c4] == 0xffffffff) {
    puVar2[0x13c4] = 0;
  }
  local_38 = entry;
  piVar5 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (piVar5 == (int *)0x0) {
    iVar4 = 1;
  }
  else {
    if ((puVar2[0x3e] == 0) &&
       ((((char)*piVar5 == 'M' && (*(char *)((long)piVar5 + 1) == 'Z')) || (*piVar5 == 0x464c457f)))
       ) {
      lVar10 = 0;
      unaff_EBP = 0x71a21;
      uVar11 = 0x1000;
      do {
        while( true ) {
          if (0x20000 < uVar11 + lVar10) goto LAB_003d4ae3;
          pvVar6 = __archive_read_ahead(a,uVar11,(ssize_t *)&local_40);
          if (pvVar6 == (void *)0x0) break;
          if (CONCAT44(uStack_3c,local_40) < 0x40) goto LAB_003d4ae3;
          request = 0;
          do {
            if (*(int *)((long)pvVar6 + request + 3) == 0x71a21 &&
                *(int *)((long)pvVar6 + request) == 0x21726152) {
              __archive_read_consume(a,request);
              bVar12 = false;
              iVar4 = 0;
              goto LAB_003d4b01;
            }
            request_00 = request + 0x10;
            lVar3 = request + 0x17;
            request = request_00;
          } while ((ulong)((long)pvVar6 + lVar3) <
                   (ulong)(CONCAT44(uStack_3c,local_40) + (long)pvVar6));
          __archive_read_consume(a,request_00);
          lVar10 = lVar10 + request_00;
        }
        bVar12 = 0x7f < uVar11;
        uVar11 = uVar11 >> 1;
      } while (bVar12);
LAB_003d4ae3:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
      iVar4 = -0x1e;
      bVar12 = true;
LAB_003d4b01:
      if (bVar12) {
        return iVar4;
      }
    }
    puVar2[0x3e] = 1;
    do {
      bVar12 = false;
      piVar5 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      iVar4 = -0x1e;
      if (piVar5 == (int *)0x0) goto LAB_003d4d9c;
      head_type = *(char *)((long)piVar5 + 2);
      switch(head_type) {
      case 'r':
        if (*(int *)((long)piVar5 + 3) == 0x71a21 && *piVar5 == 0x21726152) {
          uVar11 = 7;
LAB_003d4d8c:
          __archive_read_consume(a,uVar11);
LAB_003d4d97:
          bVar12 = true;
          iVar4 = unaff_EBP;
          goto LAB_003d4d9c;
        }
        pcVar9 = "Invalid marker header";
        goto LAB_003d4d0e;
      case 's':
        *puVar2 = (uint)*(ushort *)((long)piVar5 + 3);
        uVar1 = *(ushort *)((long)piVar5 + 5);
        uVar11 = (ulong)uVar1;
        if (uVar1 < 0xd) {
          pcVar9 = "Invalid header size";
LAB_003d4b75:
          archive_set_error(&a->archive,0x54,pcVar9);
        }
        else {
          psVar8 = (short *)__archive_read_ahead(a,uVar11,(ssize_t *)0x0);
          entry_00 = local_38;
          if (psVar8 != (short *)0x0) {
            *(undefined2 *)(puVar2 + 4) = *(undefined2 *)((long)psVar8 + 7);
            *(undefined4 *)((long)puVar2 + 0x12) = *(undefined4 *)((long)psVar8 + 9);
            if ((*puVar2 >> 9 & 1) != 0) {
              if (uVar1 == 0xd) {
                pcVar9 = "Invalid header size";
                goto LAB_003d4d2b;
              }
              *(undefined1 *)((long)puVar2 + 0x16) = *(undefined1 *)((long)psVar8 + 0xd);
            }
            if ((char)*puVar2 < '\0') {
              archive_entry_set_is_metadata_encrypted(local_38,'\x01');
              archive_entry_set_is_data_encrypted(entry_00,'\x01');
              puVar2[0x13c4] = 1;
              pcVar9 = "RAR encryption support unavailable.";
              goto LAB_003d4d2b;
            }
            uVar7 = cm_zlib_crc32(0,(uchar *)(psVar8 + 1),uVar1 - 2);
            if (*psVar8 == (short)uVar7) goto LAB_003d4d8c;
            pcVar9 = "Header CRC error";
            goto LAB_003d4b75;
          }
        }
LAB_003d4b7c:
        bVar12 = false;
        iVar4 = -0x1e;
        goto LAB_003d4d9c;
      case 't':
        iVar4 = read_header(a,local_38,head_type);
        break;
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case '{':
        uVar1 = *(ushort *)((long)piVar5 + 5);
        uVar11 = (ulong)uVar1;
        if (uVar1 < 7) {
LAB_003d4b64:
          pcVar9 = "Invalid header size too small";
          goto LAB_003d4b75;
        }
        if ((char)piVar5[1] < '\0') {
          if (uVar1 < 0xb) goto LAB_003d4b64;
          piVar5 = (int *)__archive_read_ahead(a,uVar11,(ssize_t *)0x0);
          if (piVar5 == (int *)0x0) goto LAB_003d4b7c;
          uVar11 = uVar11 + *(uint *)((long)piVar5 + 7);
        }
        iVar4 = *piVar5;
        __archive_read_consume(a,2);
        uVar7 = 0;
        for (uVar11 = uVar11 - 2; uVar11 != 0; uVar11 = uVar11 - CONCAT44(uStack_3c,local_40)) {
          min = 0x8000;
          if (uVar11 < 0x8000) {
            min = uVar11;
          }
          buf = (uchar *)__archive_read_ahead(a,min,(ssize_t *)&local_40);
          if (buf == (uchar *)0x0) {
            bVar12 = false;
            iVar4 = -0x1e;
            goto LAB_003d4d9c;
          }
          uVar7 = cm_zlib_crc32(uVar7,buf,local_40);
          __archive_read_consume(a,CONCAT44(uStack_3c,local_40));
        }
        if ((short)iVar4 != (short)uVar7) {
          pcVar9 = "Header CRC error";
LAB_003d4d2b:
          archive_set_error(&a->archive,0x54,pcVar9);
          goto LAB_003d4b7c;
        }
        if (head_type != '{') goto LAB_003d4d97;
        iVar4 = 1;
        break;
      case 'z':
        iVar4 = read_header(a,local_38,head_type);
        if (-0x15 < iVar4) goto LAB_003d4d97;
        break;
      default:
        pcVar9 = "Bad RAR file";
LAB_003d4d0e:
        bVar12 = false;
        archive_set_error(&a->archive,0x54,pcVar9);
        goto LAB_003d4d9c;
      }
      bVar12 = false;
LAB_003d4d9c:
      unaff_EBP = iVar4;
    } while (bVar12);
  }
  return iVar4;
}

Assistant:

static int
archive_read_format_rar_read_header(struct archive_read *a,
                                    struct archive_entry *entry)
{
  const void *h;
  const char *p;
  struct rar *rar;
  size_t skip;
  char head_type;
  int ret;
  unsigned flags;
  unsigned long crc32_expected;

  a->archive.archive_format = ARCHIVE_FORMAT_RAR;
  if (a->archive.archive_format_name == NULL)
    a->archive.archive_format_name = "RAR";

  rar = (struct rar *)(a->format->data);

  /*
   * It should be sufficient to call archive_read_next_header() for
   * a reader to determine if an entry is encrypted or not. If the
   * encryption of an entry is only detectable when calling
   * archive_read_data(), so be it. We'll do the same check there
   * as well.
   */
  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  /* RAR files can be generated without EOF headers, so return ARCHIVE_EOF if
  * this fails.
  */
  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_EOF);

  p = h;
  if (rar->found_first_header == 0 &&
     ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0)) {
    /* This is an executable ? Must be self-extracting... */
    ret = skip_sfx(a);
    if (ret < ARCHIVE_WARN)
      return (ret);
  }
  rar->found_first_header = 1;

  while (1)
  {
    unsigned long crc32_val;

    if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
      return (ARCHIVE_FATAL);
    p = h;

    head_type = p[2];
    switch(head_type)
    {
    case MARK_HEAD:
      if (memcmp(p, RAR_SIGNATURE, 7) != 0) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid marker header");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, 7);
      break;

    case MAIN_HEAD:
      rar->main_flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size");
        return (ARCHIVE_FATAL);
      }
      if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
        return (ARCHIVE_FATAL);
      p = h;
      memcpy(rar->reserved1, p + 7, sizeof(rar->reserved1));
      memcpy(rar->reserved2, p + 7 + sizeof(rar->reserved1),
             sizeof(rar->reserved2));
      if (rar->main_flags & MHD_ENCRYPTVER) {
        if (skip < 7 + sizeof(rar->reserved1) + sizeof(rar->reserved2)+1) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size");
          return (ARCHIVE_FATAL);
        }
        rar->encryptver = *(p + 7 + sizeof(rar->reserved1) +
                            sizeof(rar->reserved2));
      }

      /* Main header is password encrypted, so we cannot read any
         file names or any other info about files from the header. */
      if (rar->main_flags & MHD_PASSWORD)
      {
        archive_entry_set_is_metadata_encrypted(entry, 1);
        archive_entry_set_is_data_encrypted(entry, 1);
        rar->has_encrypted_entries = 1;
         archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "RAR encryption support unavailable.");
        return (ARCHIVE_FATAL);
      }

      crc32_val = crc32(0, (const unsigned char *)p + 2, (unsigned)skip - 2);
      if ((crc32_val & 0xffff) != archive_le16dec(p)) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Header CRC error");
        return (ARCHIVE_FATAL);
      }
      __archive_read_consume(a, skip);
      break;

    case FILE_HEAD:
      return read_header(a, entry, head_type);

    case COMM_HEAD:
    case AV_HEAD:
    case SUB_HEAD:
    case PROTECT_HEAD:
    case SIGN_HEAD:
    case ENDARC_HEAD:
      flags = archive_le16dec(p + 3);
      skip = archive_le16dec(p + 5);
      if (skip < 7) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid header size too small");
        return (ARCHIVE_FATAL);
      }
      if (flags & HD_ADD_SIZE_PRESENT)
      {
        if (skip < 7 + 4) {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
            "Invalid header size too small");
          return (ARCHIVE_FATAL);
        }
        if ((h = __archive_read_ahead(a, skip, NULL)) == NULL)
          return (ARCHIVE_FATAL);
        p = h;
        skip += archive_le32dec(p + 7);
      }

      /* Skip over the 2-byte CRC at the beginning of the header. */
      crc32_expected = archive_le16dec(p);
      __archive_read_consume(a, 2);
      skip -= 2;

      /* Skim the entire header and compute the CRC. */
      crc32_val = 0;
      while (skip > 0) {
	      size_t to_read = skip;
	      ssize_t did_read;
	      if (to_read > 32 * 1024) {
		      to_read = 32 * 1024;
	      }
	      if ((h = __archive_read_ahead(a, to_read, &did_read)) == NULL) {
		      return (ARCHIVE_FATAL);
	      }
	      p = h;
	      crc32_val = crc32(crc32_val, (const unsigned char *)p, (unsigned)did_read);
	      __archive_read_consume(a, did_read);
	      skip -= did_read;
      }
      if ((crc32_val & 0xffff) != crc32_expected) {
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		  "Header CRC error");
	      return (ARCHIVE_FATAL);
      }
      if (head_type == ENDARC_HEAD)
	      return (ARCHIVE_EOF);
      break;

    case NEWSUB_HEAD:
      if ((ret = read_header(a, entry, head_type)) < ARCHIVE_WARN)
        return ret;
      break;

    default:
      archive_set_error(&a->archive,  ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file");
      return (ARCHIVE_FATAL);
    }
  }
}